

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

QVariant * operator-(QVariant *__return_storage_ptr__,QVariant *arg1,QVariant *arg2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  QDateTime dt;
  undefined4 uStack_6c;
  QDateTime a2;
  QDateTime a1;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  iVar1 = QVariant::typeId(arg1);
  iVar2 = QVariant::typeId(arg2);
  if (iVar1 != iVar2) {
    local_58._0_4_ = 2;
    local_58._20_4_ = 0;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_40 = "default";
    uVar6 = QVariant::typeName();
    uVar7 = QVariant::typeName();
    QMessageLogger::warning
              ((char *)local_58.data,
               "QAbstractSpinBox: Internal error: Different types (%s vs %s) (%s:%d)",uVar6,uVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qabstractspinbox.cpp"
               ,0x7fa);
  }
  iVar1 = QVariant::typeId(arg1);
  if (iVar1 == 0x10) {
    _a1 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    _a2 = &DAT_aaaaaaaaaaaaaaaa;
    QVariant::toDateTime();
    uVar3 = QDateTime::daysTo(&a2);
    uVar4 = QDateTime::secsTo(&a2);
    local_58._0_4_ = QDateTime::time();
    iVar1 = QTime::msec();
    uVar5 = QDateTime::time();
    _dt = (undefined1 *)CONCAT44(uStack_6c,uVar5);
    iVar2 = QTime::msec();
    if ((int)(uVar4 | uVar3) < 0) {
      QVariant::operator=(__return_storage_ptr__,arg1);
    }
    else {
      _dt = &DAT_aaaaaaaaaaaaaaaa;
      QDateTime::addDays((longlong)&local_58);
      QDateTime::addSecs((longlong)&dt);
      QDateTime::~QDateTime((QDateTime *)local_58.data);
      if (0 < iVar1 - iVar2) {
        local_58._0_4_ = QDateTime::time();
        uVar5 = QTime::addMSecs((int)&local_58);
        QDateTime::setTime(&dt,uVar5,1);
      }
      QVariant::QVariant((QVariant *)&local_58,&dt);
      QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_58);
      QDateTime::~QDateTime(&dt);
    }
    QDateTime::~QDateTime(&a2);
    QDateTime::~QDateTime(&a1);
  }
  else {
    if (iVar1 == 6) {
      dVar8 = (double)QVariant::toDouble((bool *)arg1);
      dVar9 = (double)QVariant::toDouble((bool *)arg2);
      QVariant::QVariant((QVariant *)&local_58,dVar8 - dVar9);
    }
    else {
      if (iVar1 != 2) goto LAB_00441339;
      iVar1 = QVariant::toInt((bool *)arg1);
      iVar2 = QVariant::toInt((bool *)arg2);
      QVariant::QVariant((QVariant *)&local_58,iVar1 - iVar2);
    }
    QVariant::operator=(__return_storage_ptr__,(QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
  }
LAB_00441339:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant operator-(const QVariant &arg1, const QVariant &arg2)
{
    QVariant ret;
    if (Q_UNLIKELY(arg1.userType() != arg2.userType()))
        qWarning("QAbstractSpinBox: Internal error: Different types (%s vs %s) (%s:%d)",
                 arg1.typeName(), arg2.typeName(), __FILE__, __LINE__);
    switch (arg1.userType()) {
    case QMetaType::Int: ret = QVariant(arg1.toInt() - arg2.toInt()); break;
    case QMetaType::Double: ret = QVariant(arg1.toDouble() - arg2.toDouble()); break;
    case QMetaType::QDateTime: {
        QDateTime a1 = arg1.toDateTime();
        QDateTime a2 = arg2.toDateTime();
        int days = a2.daysTo(a1);
        int secs = a2.secsTo(a1);
        int msecs = qMax(0, a1.time().msec() - a2.time().msec());
        if (days < 0 || secs < 0 || msecs < 0) {
            ret = arg1;
        } else {
            QDateTime dt = a2.addDays(days).addSecs(secs);
            if (msecs > 0)
                dt.setTime(dt.time().addMSecs(msecs));
            ret = QVariant(dt);
        }
        break;
    }
    default: break;
    }
    return ret;
}